

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O3

int coda_ascii_cursor_read_uint16(coda_cursor *cursor,uint16_t *dst)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  uint64_t value;
  ulong local_18;
  
  local_18 = in_RAX;
  iVar1 = coda_ascii_cursor_read_uint64(cursor,&local_18);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (local_18 < 0x10000) {
      *dst = (uint16_t)local_18;
      iVar2 = 0;
    }
    else {
      coda_set_error(-300,"product error detected (value for ascii integer too large for uint16)");
    }
  }
  return iVar2;
}

Assistant:

int coda_ascii_cursor_read_uint16(const coda_cursor *cursor, uint16_t *dst)
{
    uint64_t value;

    if (coda_ascii_cursor_read_uint64(cursor, &value) != 0)
    {
        return -1;
    }
    if (value > MAXUINT16)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (value for ascii integer too large for uint16)");
        return -1;
    }
    *dst = (uint16_t)value;

    return 0;
}